

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

Curl_addrinfo * addr_first_match(Curl_addrinfo *addr,int family)

{
  Curl_addrinfo *pCStack_18;
  int family_local;
  Curl_addrinfo *addr_local;
  
  pCStack_18 = addr;
  while( true ) {
    if (pCStack_18 == (Curl_addrinfo *)0x0) {
      return (Curl_addrinfo *)0x0;
    }
    if (pCStack_18->ai_family == family) break;
    pCStack_18 = pCStack_18->ai_next;
  }
  return pCStack_18;
}

Assistant:

static const struct Curl_addrinfo *
addr_first_match(const struct Curl_addrinfo *addr, int family)
{
  while(addr) {
    if(addr->ai_family == family)
      return addr;
    addr = addr->ai_next;
  }
  return NULL;
}